

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cc
# Opt level: O2

void __thiscall
lrit::File::File(File *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *buf)

{
  _Rb_tree_header *p_Var1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __first;
  pointer puVar2;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  local_58;
  
  (this->file_)._M_dataplus._M_p = (pointer)&(this->file_).field_2;
  (this->file_)._M_string_length = 0;
  (this->file_).field_2._M_local_buf[0] = '\0';
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->buf_,buf);
  (this->header_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->header_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->header_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->m_)._M_t._M_impl.super__Rb_tree_header;
  (this->m_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this_00 = &this->header_;
  __first._M_current =
       (this->buf_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)this_00,(const_iterator)0x0,
             __first,(__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      )(__first._M_current + 0x10));
  getHeader<lrit::PrimaryHeader>((PrimaryHeader *)&local_58,this_00,0);
  (this->ph_).dataLength = (uint64_t)local_58._M_impl.super__Rb_tree_header._M_header._M_parent;
  (this->ph_).headerType = local_58._M_impl._0_1_;
  (this->ph_).field_0x1 = local_58._M_impl._1_1_;
  (this->ph_).headerLength = local_58._M_impl._2_2_;
  (this->ph_).fileType = local_58._M_impl._4_1_;
  *(undefined3 *)&(this->ph_).field_0x5 = local_58._M_impl._5_3_;
  (this->ph_).totalHeaderLength = local_58._M_impl.super__Rb_tree_header._M_header._M_color;
  *(undefined4 *)&(this->ph_).field_0xc = local_58._M_impl.super__Rb_tree_header._M_header._4_4_;
  puVar2 = (this->buf_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)this_00,
             (const_iterator)
             (this->header_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_finish,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )(puVar2 + 0x10),
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )(puVar2 + (this->ph_).totalHeaderLength));
  getHeaderMap((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
               &local_58,this_00);
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::operator=(&(this->m_)._M_t,&local_58);
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~_Rb_tree(&local_58);
  return;
}

Assistant:

File::File(const std::vector<uint8_t>& buf) : buf_(buf) {
  // First 16 bytes hold the primary header
  header_.insert(header_.end(), buf_.begin(), buf_.begin() + 16);

  // Parse primary header
  ph_ = lrit::getHeader<lrit::PrimaryHeader>(header_, 0);

  // Read remaining headers
  header_.insert(
    header_.end(),
    buf_.begin() + 16,
    buf_.begin() + ph_.totalHeaderLength);

  // Build header map
  m_ = lrit::getHeaderMap(header_);
}